

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

fft_object fft_init(int N,int sgn)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int local_2c;
  int M;
  int K;
  int out;
  int ct;
  int twi_len;
  fft_object obj;
  int sgn_local;
  int N_local;
  
  iVar1 = dividebyN(N);
  if (iVar1 == 1) {
    _ct = (fft_object)malloc((long)(N + -1) * 0x10 + 0x120);
    iVar1 = factors(N,_ct->factors);
    _ct->lf = iVar1;
    longvectorN(_ct->twiddle,N,_ct->factors,_ct->lf);
    _ct->lt = 0;
    out = N;
  }
  else {
    dVar2 = log10((double)N);
    dVar3 = log10(2.0);
    dVar2 = ceil(dVar2 / dVar3);
    dVar2 = pow(2.0,dVar2);
    local_2c = (int)dVar2;
    if (local_2c < N * 2 + -2) {
      local_2c = local_2c << 1;
    }
    _ct = (fft_object)malloc((long)(local_2c + -1) * 0x10 + 0x120);
    iVar1 = factors(local_2c,_ct->factors);
    _ct->lf = iVar1;
    longvectorN(_ct->twiddle,local_2c,_ct->factors,_ct->lf);
    _ct->lt = 1;
    out = local_2c;
  }
  _ct->N = N;
  _ct->sgn = sgn;
  if (sgn == -1) {
    for (K = 0; K < out; K = K + 1) {
      _ct->twiddle[K].im = -_ct->twiddle[K].im;
    }
  }
  return _ct;
}

Assistant:

fft_object fft_init(int N, int sgn) {
	fft_object obj = NULL;
	// Change N/2 to N-1 for longvector case

	int twi_len,ct,out;
	out = dividebyN(N);

	if (out == 1) {
		obj = (fft_object) malloc (sizeof(struct fft_set) + sizeof(fft_data)* (N-1));
		obj->lf = factors(N,obj->factors);
		longvectorN(obj->twiddle,N,obj->factors,obj->lf);
		twi_len = N;
		obj->lt = 0;
	} else {
		int K,M;
		K = (int) pow(2.0,ceil(log10(N)/log10(2.0)));

		if (K < 2 * N - 2) {
			M = K * 2;
		} else {
			M = K;
		}
		obj = (fft_object) malloc (sizeof(struct fft_set) + sizeof(fft_data)* (M-1));
		obj->lf = factors(M,obj->factors);
		longvectorN(obj->twiddle,M,obj->factors,obj->lf);
		obj->lt = 1;
		twi_len = M;
	}


	obj->N = N;
	obj->sgn = sgn;

	if (sgn == -1) {
		for(ct = 0; ct < twi_len;ct++) {
			(obj->twiddle+ct)->im = - (obj->twiddle+ct)->im;

		}
	}

	return obj;
}